

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingGraph.cpp
# Opt level: O0

string * __thiscall
ProblemFOBSFireFightingGraph::SoftPrintBriefDescription_abi_cxx11_
          (ProblemFOBSFireFightingGraph *this,size_t nrAgents,size_t nrHouses,size_t nrFLs)

{
  ostream *poVar1;
  ulong in_RCX;
  ulong in_RDX;
  string *in_RDI;
  ulong in_R8;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"_FireFightingGraph_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,"_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,"_");
  std::ostream::operator<<(poVar1,local_28);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return in_RDI;
}

Assistant:

string ProblemFOBSFireFightingGraph::SoftPrintBriefDescription(
    size_t nrAgents, size_t nrHouses, size_t nrFLs) const
{
    stringstream ss;
    ss << "_FireFightingGraph_" << nrAgents << 
        "_" << nrHouses <<
        "_" << nrFLs;
    return ss.str();
}